

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# portability_atexit.c
# Opt level: O3

void portability_atexit_destroy(void)

{
  atexit_node_type *paVar1;
  atexit_node_type *__ptr;
  
  __ptr = atexit_list;
  if (atexit_list != (atexit_node_type *)0x0) {
    do {
      atexit_list = __ptr->next;
      if (__ptr->handler != (portability_atexit_fn)0x0) {
        (*__ptr->handler)();
      }
      paVar1 = atexit_list;
      free(__ptr);
      __ptr = paVar1;
    } while (paVar1 != (atexit_node_type *)0x0);
    atexit_list = (atexit_node_type *)0x0;
  }
  return;
}

Assistant:

static void portability_atexit_destroy(void)
{
	if (atexit_list != NULL)
	{
		do
		{
			struct atexit_node_type *prev = atexit_list;

			atexit_list = prev->next;

			if (prev->handler != NULL)
			{
				prev->handler();
			}

			free(prev);
		} while (atexit_list != NULL);

		atexit_list = NULL;
	}
}